

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassConstructor
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  Descriptor *buffer;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long *plVar4;
  Descriptor *descriptor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  int iVar5;
  Descriptor *desc_00;
  int32 i;
  Descriptor *in_R8;
  long lVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  undefined1 local_c0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string message_id;
  string local_50;
  
  (anonymous_namespace)::GetPrefix_abi_cxx11_
            ((string *)local_c0,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(desc + 0x10)
             ,*(FileDescriptor **)(desc + 0x18),in_R8);
  io::Printer::Print<char[12],std::__cxx11::string,char[10],std::__cxx11::string>
            (printer,
             "/**\n * Generated by JsPbCodeGenerator.\n * @param {Array=} opt_data Optional initial data array, typically from a\n * server response, or constructed directly in Javascript. The array is used\n * in place and becomes part of the constructed object. It is not cloned.\n * If no data is provided, the constructed object will be empty, but still\n * valid.\n * @extends {jspb.Message}\n * @constructor\n */\n$classprefix$$classname$ = function(opt_data) {\n"
             ,(char (*) [12])"classprefix",(string *)local_c0,(char (*) [10])0x3aca6c,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)desc);
  buffer = (Descriptor *)(local_c0 + 0x10);
  if ((Descriptor *)local_c0._0_8_ != buffer) {
    operator_delete((void *)local_c0._0_8_);
  }
  descriptor = desc;
  io::Printer::Annotate<google::protobuf::Descriptor>(printer,"classname","classname",desc);
  message_id._M_dataplus._M_p = (pointer)&message_id.field_2;
  message_id._M_string_length = 0;
  message_id.field_2._M_local_buf[0] = '\0';
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"0","");
  if (*(int *)(desc + 0x68) < 1) {
    iVar5 = 0;
  }
  else {
    lVar6 = 0;
    lVar7 = 0;
    iVar5 = 0;
    do {
      bVar1 = anon_unknown_0::IgnoreField((FieldDescriptor *)(*(long *)(desc + 0x28) + lVar6));
      if ((!bVar1) && (iVar2 = *(int *)(*(long *)(desc + 0x28) + 0x44 + lVar6), iVar5 < iVar2)) {
        iVar5 = iVar2;
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x98;
    } while (lVar7 < *(int *)(desc + 0x68));
  }
  iVar2 = 499;
  if (iVar5 < 499) {
    iVar2 = iVar5;
  }
  i = -1;
  if (499 < iVar5) {
    i = iVar2 + 1;
  }
  if (0 < *(int *)(desc + 0x78)) {
    i = iVar2 + 1;
  }
  local_c0._0_8_ = buffer;
  pcVar3 = FastInt32ToBufferLeft(i,(char *)buffer);
  local_c0._8_8_ = (long)pcVar3 - (long)buffer;
  desc_00 = (Descriptor *)local_c0._0_8_;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,local_c0._0_8_,(Descriptor *)(local_c0._0_8_ + local_c0._8_8_));
  bVar1 = anon_unknown_0::HasRepeatedFields((GeneratorOptions *)desc,desc_00);
  if (bVar1) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              ((string *)local_c0,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,
               descriptor);
    plVar4 = (long *)std::__cxx11::string::append(local_c0);
    local_e0._0_8_ = local_e0 + 0x10;
    descriptor = (Descriptor *)(plVar4 + 2);
    if ((Descriptor *)*plVar4 == descriptor) {
      local_d0._M_allocated_capacity = *(undefined8 *)descriptor;
      local_d0._8_8_ = plVar4[3];
    }
    else {
      local_d0._M_allocated_capacity = *(undefined8 *)descriptor;
      local_e0._0_8_ = (Descriptor *)*plVar4;
    }
    local_e0._8_8_ = plVar4[1];
    *plVar4 = (long)descriptor;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
  }
  else {
    local_e0._0_8_ = local_e0 + 0x10;
    local_e0._8_8_ = 4;
    local_d0._M_allocated_capacity._0_5_ = 0x6c6c756e;
  }
  if ((bVar1) && ((Descriptor *)local_c0._0_8_ != buffer)) {
    operator_delete((void *)local_c0._0_8_);
  }
  (anonymous_namespace)::OneofFieldsArrayName_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,descriptor);
  args_1 = &local_100;
  io::Printer::
  Print<char[10],std::__cxx11::string,char[6],std::__cxx11::string,char[10],std::__cxx11::string,char[12],std::__cxx11::string>
            (printer,
             "  jspb.Message.initialize(this, opt_data, $messageId$, $pivot$, $rptfields$, $oneoffields$);\n"
             ,(char (*) [10])"messageId",args_1,(char (*) [6])"pivot",&local_90,
             (char (*) [10])"rptfields",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
             (char (*) [12])"oneoffields",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((Descriptor *)local_e0._0_8_ != (Descriptor *)(local_e0 + 0x10)) {
    operator_delete((void *)local_e0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_100,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,
             (Descriptor *)args_1);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "};\ngoog.inherits($classname$, jspb.Message);\nif (goog.DEBUG && !COMPILED) {\n  /**\n   * @public\n   * @override\n   */\n  $classname$.displayName = \'$classname$\';\n}\n"
             ,(char (*) [10])0x3aca6c,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)message_id._M_dataplus._M_p != &message_id.field_2) {
    operator_delete(message_id._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Generator::GenerateClassConstructor(const GeneratorOptions& options,
                                         io::Printer* printer,
                                         const Descriptor* desc) const {
  printer->Print(
      "/**\n"
      " * Generated by JsPbCodeGenerator.\n"
      " * @param {Array=} opt_data Optional initial data array, typically "
      "from a\n"
      " * server response, or constructed directly in Javascript. The array "
      "is used\n"
      " * in place and becomes part of the constructed object. It is not "
      "cloned.\n"
      " * If no data is provided, the constructed object will be empty, but "
      "still\n"
      " * valid.\n"
      " * @extends {jspb.Message}\n"
      " * @constructor\n"
      " */\n"
      "$classprefix$$classname$ = function(opt_data) {\n",
      "classprefix", GetMessagePathPrefix(options, desc), "classname",
      desc->name());
  printer->Annotate("classname", desc);
  std::string message_id = GetMessageId(desc);
  printer->Print(
      "  jspb.Message.initialize(this, opt_data, $messageId$, $pivot$, "
      "$rptfields$, $oneoffields$);\n",
      "messageId",
      !message_id.empty() ? ("'" + message_id + "'")
                          : (IsResponse(desc) ? "''" : "0"),
      "pivot", GetPivot(desc), "rptfields",
      RepeatedFieldsArrayName(options, desc), "oneoffields",
      OneofFieldsArrayName(options, desc));
  printer->Print(
      "};\n"
      "goog.inherits($classname$, jspb.Message);\n"
      "if (goog.DEBUG && !COMPILED) {\n"
      // displayName overrides Function.prototype.displayName
      // http://google3/javascript/externs/es3.js?l=511
      "  /**\n"
      "   * @public\n"
      "   * @override\n"
      "   */\n"
      "  $classname$.displayName = '$classname$';\n"
      "}\n",
      "classname", GetMessagePath(options, desc));
}